

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookupTable.h
# Opt level: O1

IDTy __thiscall dg::PointerIDLookupTable::getOrCreate(PointerIDLookupTable *this,Pointer *ptr)

{
  iterator __position;
  type tVar1;
  IDTy IVar2;
  _Hashtable<dg::Offset,std::pair<dg::Offset_const,unsigned_long>,std::allocator<std::pair<dg::Offset_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<dg::Offset>,std::hash<dg::Offset>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var3;
  
  IVar2 = get(this,ptr);
  if (IVar2 == 0) {
    __position._M_current = *(Pointer **)&this->field_0x40;
    if (__position._M_current == *(Pointer **)&this->field_0x48) {
      std::vector<dg::pta::Pointer,std::allocator<dg::pta::Pointer>>::
      _M_realloc_insert<dg::pta::Pointer_const&>
                ((vector<dg::pta::Pointer,std::allocator<dg::pta::Pointer>> *)&this->_idToPtr,
                 __position,ptr);
    }
    else {
      tVar1 = (ptr->offset).offset;
      (__position._M_current)->target = ptr->target;
      ((__position._M_current)->offset).offset = tVar1;
      *(long *)&this->field_0x40 = *(long *)&this->field_0x40 + 0x10;
    }
    IVar2 = *(long *)&this->field_0x40 - *(long *)&this->_idToPtr >> 4;
    p_Var3 = (_Hashtable<dg::Offset,std::pair<dg::Offset_const,unsigned_long>,std::allocator<std::pair<dg::Offset_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<dg::Offset>,std::hash<dg::Offset>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)std::__detail::
                _Map_base<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::pta::PSNode_*>,_std::hash<dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::pta::PSNode_*>,_std::hash<dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this,&ptr->target);
    std::
    _Hashtable<dg::Offset,std::pair<dg::Offset_const,unsigned_long>,std::allocator<std::pair<dg::Offset_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<dg::Offset>,std::hash<dg::Offset>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<dg::Offset,unsigned_long>>(p_Var3);
  }
  return IVar2;
}

Assistant:

IDTy getOrCreate(const Pointer &ptr) {
        auto res = get(ptr);
        if (res != 0)
            return res;

        _idToPtr.push_back(ptr);
        res = _idToPtr.size();
#ifndef NDEBUG
        bool r =
#endif
                _ptrToID[ptr.target].put(ptr.offset, res);

        assert(r && "Duplicated ID!");
        assert(get(res) == ptr);
        assert(res == get(ptr));
        assert(res > 0 && "ID must always be greater than 0");
        return res;
    }

    IDTy get(const Pointer &ptr) const {
        auto it = _ptrToID.find(ptr.target);
        if (it == _ptrToID.end()) {
            return 0; // invalid ID
        }
        auto it2 = it->second.find(ptr.offset);
        if (it2 == it->second.end())
            return 0;
        return it2->second;
    }

    const Pointer &get(IDTy id) const {
        assert(id - 1 < _idToPtr.size());
        return _idToPtr[id - 1];
    }

  private:
    // PSNode -> (Offset -> id)
    // Not space efficient, but we need mainly the time efficiency here...
    // NOTE: unfortunately, atm, we cannot use the id of the target for hashing
    // because it would break repeated runs of the analysis
    // as multiple graphs will contain nodes with the same id
    // (and resetting the state is really painful, I tried that,
    // but just didn't succeed).
    PtrToIDMap _ptrToID;
    std::vector<Pointer> _idToPtr; // starts from 0 (pointer = idVector[id - 1])
}